

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMRangeImpl::updateRangeForDeletedText
          (DOMRangeImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  ulong uVar1;
  uint uVar2;
  XMLSize_t XVar3;
  
  if (node == (DOMNode *)0x0) {
    return;
  }
  uVar2 = (*this->fStartContainer->_vptr_DOMNode[4])();
  if (((this->fStartContainer == node) && ((ushort)uVar2 < 9)) &&
     ((0x198U >> (uVar2 & 0x1f) & 1) != 0)) {
    uVar1 = this->fStartOffset;
    if (count + offset < uVar1) {
      XVar3 = uVar1 - count;
    }
    else {
      XVar3 = offset;
      if (uVar1 <= offset) goto LAB_002854a6;
    }
    this->fStartOffset = XVar3;
  }
LAB_002854a6:
  uVar2 = (*this->fEndContainer->_vptr_DOMNode[4])();
  if (((this->fEndContainer == node) && ((ushort)uVar2 < 9)) &&
     ((0x198U >> (uVar2 & 0x1f) & 1) != 0)) {
    uVar1 = this->fEndOffset;
    if (count + offset < uVar1) {
      offset = uVar1 - count;
    }
    else if (uVar1 <= offset) {
      return;
    }
    this->fEndOffset = offset;
  }
  return;
}

Assistant:

void DOMRangeImpl::updateRangeForDeletedText(DOMNode* node, XMLSize_t offset, XMLSize_t count)
{
    if (node == 0) return;

    short type = fStartContainer->getNodeType();
    if (node == fStartContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        if (fStartOffset > offset+count) {
            fStartOffset = fStartOffset-count;
        } else if (fStartOffset > offset) {
            fStartOffset = offset;
        }
    }
    type = fEndContainer->getNodeType();
    if (node == fEndContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        if (fEndOffset > offset+count) {
            fEndOffset = fEndOffset-count;
        } else if (fEndOffset > offset) {
            fEndOffset = offset;
        }
    }
}